

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.c
# Opt level: O2

MPI_Comm createCommGrid(int *rank,int *dims)

{
  int nproc;
  MPI_Comm Region;
  int periods [2];
  
  periods[0] = 0;
  periods[1] = 0;
  dims[0] = 0;
  dims[1] = 0;
  MPI_Comm_size(&ompi_mpi_comm_world,&nproc);
  MPI_Dims_create(nproc,2,dims);
  MPI_Cart_create(&ompi_mpi_comm_world,2,dims,periods,1,&Region);
  MPI_Comm_rank(Region,rank);
  if (*rank == 0) {
    printf("size: %i, dims: [%ix%i]\n",(ulong)(uint)nproc,(ulong)(uint)*dims,(ulong)(uint)dims[1]);
  }
  return Region;
}

Assistant:

MPI_Comm createCommGrid (int *rank, int *dims)
{
	MPI_Comm Region;
	int  nproc, periods[2] = {0,0};
	dims[0] = dims[1] = 0;
	MPI_Comm_size(MPI_COMM_WORLD,&nproc);
	MPI_Dims_create(nproc,2,dims);
	MPI_Cart_create(MPI_COMM_WORLD,2,dims,periods,1,&Region);
	MPI_Comm_rank(Region,rank);
	if (*rank == 0)
		printf("size: %i, dims: [%ix%i]\n",nproc,dims[0],dims[1]);
	return Region;
}